

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# missing_deps_test.cc
# Opt level: O3

void __thiscall
MissingDependencyScannerTestCycleInGraph::Run(MissingDependencyScannerTestCycleInGraph *this)

{
  Test *this_00;
  bool bVar1;
  int iVar2;
  string err;
  vector<Node_*,_std::allocator<Node_*>_> nodes;
  string local_50;
  vector<Node_*,_std::allocator<Node_*>_> local_30;
  
  MissingDependencyScannerTest::CreateInitialState(&this->super_MissingDependencyScannerTest);
  MissingDependencyScannerTest::CreateGraphDependencyBetween
            (&this->super_MissingDependencyScannerTest,"compiled_object","generated_header");
  MissingDependencyScannerTest::CreateGraphDependencyBetween
            (&this->super_MissingDependencyScannerTest,"generated_header","compiled_object");
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  State::RootNodes(&local_30,&(this->super_MissingDependencyScannerTest).state_,&local_50);
  this_00 = g_current_test;
  iVar2 = std::__cxx11::string::compare((char *)&local_50);
  bVar1 = testing::Test::Check
                    (this_00,iVar2 != 0,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/missing_deps_test.cc"
                     ,0xa0,"\"\" != err");
  if (!bVar1) {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  if (local_30.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_30.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_30.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_30.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

TEST_F(MissingDependencyScannerTest, CycleInGraph) {
  CreateInitialState();
  CreateGraphDependencyBetween("compiled_object", "generated_header");
  CreateGraphDependencyBetween("generated_header", "compiled_object");
  // The missing-deps tool doesn't deal with cycles in the graph, because
  // there will be an error loading the graph before we get to the tool.
  // This test is to illustrate that.
  std::string err;
  std::vector<Node*> nodes = state_.RootNodes(&err);
  ASSERT_NE("", err);
}